

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

void __thiscall mkvmuxer::Tracks::~Tracks(Tracks *this)

{
  Track *track;
  uint32_t i;
  Tracks *this_local;
  
  if (this->track_entries_ != (Track **)0x0) {
    for (track._4_4_ = 0; track._4_4_ < this->track_entries_size_; track._4_4_ = track._4_4_ + 1) {
      if (this->track_entries_[track._4_4_] != (Track *)0x0) {
        (*this->track_entries_[track._4_4_]->_vptr_Track[1])();
      }
    }
    if (this->track_entries_ != (Track **)0x0) {
      operator_delete__(this->track_entries_);
    }
  }
  return;
}

Assistant:

Tracks::~Tracks() {
  if (track_entries_) {
    for (uint32_t i = 0; i < track_entries_size_; ++i) {
      Track* const track = track_entries_[i];
      delete track;
    }
    delete[] track_entries_;
  }
}